

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O0

int __thiscall ExtraData::parseCodePageStream(ExtraData *this,TypedPropertyValue *value,int from)

{
  int iVar1;
  ostream *poVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  const_iterator local_50;
  int local_48;
  int posNullTerminator;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  int local_20;
  int local_1c;
  int len;
  int from_local;
  TypedPropertyValue *value_local;
  ExtraData *this_local;
  
  local_1c = from;
  _len = value;
  value_local = (TypedPropertyValue *)this;
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"MUST be a CodePageString.");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"              Value:                ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"                 CodePageString:    ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38,&value->Value);
  iVar1 = Utils::lenFourBytesFromPos(&local_38,local_1c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
  local_20 = iVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,"                     Size:          ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
  poVar2 = std::operator<<(poVar2," bytes");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "The size in bytes of the Characters field, including the null terminator, "
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "but not including padding (if any). If the property set\'s CodePage property "
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "has the value CP_WINUNICODE (0x04B0), then the value MUST be a multiple of 2."
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if (local_20 == 0x4b0) {
    local_20 = 0x960;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"                     Characters:    ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  if (0 < local_20) {
    local_58._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&value->Value);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_50,&local_58);
    local_48 = Utils::getCountOfBytesBeforeNullTerminatorInt(local_50);
    if (local_20 == 0x4b0) {
      Utils::print_vec_unicode_from_to(&value->Value,local_1c + 4,local_1c + local_48);
    }
    else {
      Utils::print_vec_unicode_from_to(&value->Value,local_1c + 4,local_1c + local_48);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "If Size is nonzero and the CodePage property set\'s CodePage property ")
  ;
  poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "has the value CP_WINUNICODE (0x04B0), then the value MUST be a null-terminated array "
                          );
  poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "of 16-bit Unicode characters, followed by zero padding to a multiple of 4 bytes."
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "If Size is nonzero and the property set\'s CodePage property has any other value, "
                          );
  poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "it MUST be a null-terminated array of 8-bit characters from the code page "
                          );
  poVar2 = std::operator<<(poVar2,(string *)Utils::defaultOffsetDocInfo_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,
                           "identified by the CodePage property, followed by zero padding to a multiple of 4 bytes."
                          );
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return local_20 + 4;
}

Assistant:

int ExtraData::parseCodePageStream(ExtraData::PropertyStorePropsStruct::StringOrIntegerName::TypedPropertyValue value, int from) {
    cout << Utils::defaultOffsetDocInfo << "MUST be a CodePageString." << endl;
    cout << "              Value:                " << endl;
    cout << "                 CodePageString:    " << endl;
    int len = Utils::lenFourBytesFromPos(value.Value, from);
    cout << "                     Size:          " << len << " bytes" << endl <<
         Utils::defaultOffsetDocInfo << "The size in bytes of the Characters field, including the null terminator, " << endl <<
         Utils::defaultOffsetDocInfo << "but not including padding (if any). If the property set's CodePage property " << endl <<
         Utils::defaultOffsetDocInfo << "has the value CP_WINUNICODE (0x04B0), then the value MUST be a multiple of 2." << endl;
    if(len == 0x04B0)
        len *= 2;
    cout << "                     Characters:    " << endl;
    if(len > 0) {;
        int posNullTerminator = Utils::getCountOfBytesBeforeNullTerminatorInt(value.Value.begin());
        if(len == 0x04B0) {
            Utils::print_vec_unicode_from_to(value.Value, from + 4, from + posNullTerminator);
        } else {
            Utils::print_vec_unicode_from_to(value.Value, from + 4, from + posNullTerminator);
        }
    }
    cout << Utils::defaultOffsetDocInfo << "If Size is nonzero and the CodePage property set's CodePage property " <<
         Utils::defaultOffsetDocInfo << "has the value CP_WINUNICODE (0x04B0), then the value MUST be a null-terminated array " <<
         Utils::defaultOffsetDocInfo << "of 16-bit Unicode characters, followed by zero padding to a multiple of 4 bytes." << endl <<

         Utils::defaultOffsetDocInfo << "If Size is nonzero and the property set's CodePage property has any other value, " <<
         Utils::defaultOffsetDocInfo << "it MUST be a null-terminated array of 8-bit characters from the code page " <<
         Utils::defaultOffsetDocInfo << "identified by the CodePage property, followed by zero padding to a multiple of 4 bytes." << endl;
    return len + 4;
}